

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

bool P_TestMobjZ(AActor *actor,bool quick,AActor **pOnmobj)

{
  FPortalGroupArray *this;
  int iVar1;
  bool bVar2;
  uint uVar3;
  Self *other;
  AActor *pAVar4;
  double dVar5;
  double dVar6;
  bool local_2b9;
  TFlags<ActorFlag,_unsigned_int> local_280;
  TFlags<ActorFlag,_unsigned_int> local_27c;
  TFlags<ActorFlag4,_unsigned_int> local_278;
  TFlags<ActorFlag,_unsigned_int> local_274;
  TFlags<ActorFlag,_unsigned_int> local_270;
  undefined1 local_26c [4];
  TFlags<ActorFlag,_unsigned_int> local_268;
  TFlags<ActorFlag,_unsigned_int> local_264;
  FName local_260;
  FName local_25c;
  TFlags<ActorFlag6,_unsigned_int> local_258;
  TFlags<ActorFlag2,_unsigned_int> local_254;
  TFlags<ActorFlag2,_unsigned_int> local_250;
  TFlags<ActorFlag2,_unsigned_int> local_24c;
  double local_248;
  double blockdist;
  AActor *thing;
  CheckResult cres;
  undefined1 local_200 [8];
  FMultiBlockThingsIterator it;
  FPortalGroupArray check;
  AActor *local_30;
  AActor *onmobj;
  AActor **pOnmobj_local;
  bool quick_local;
  AActor *actor_local;
  
  local_30 = (AActor *)0x0;
  iVar1 = (int)actor;
  TFlags<ActorFlag,_unsigned_int>::operator&
            ((TFlags<ActorFlag,_unsigned_int> *)&check.data.Count,
             iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
  uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&check.data.Count);
  if (uVar3 == 0) {
    this = (FPortalGroupArray *)(it.bbox.m_Box + 3);
    FPortalGroupArray::FPortalGroupArray(this,1);
    FMultiBlockThingsIterator::FMultiBlockThingsIterator
              ((FMultiBlockThingsIterator *)local_200,this,actor,-1.0,true);
    FMultiBlockThingsIterator::CheckResult::CheckResult((CheckResult *)&thing);
LAB_00671397:
    do {
      do {
        do {
          do {
            do {
              bVar2 = FMultiBlockThingsIterator::Next
                                ((FMultiBlockThingsIterator *)local_200,(CheckResult *)&thing);
              if (!bVar2) goto LAB_0067195b;
              blockdist = (double)thing;
              local_248 = thing->radius + actor->radius;
              dVar5 = AActor::X(thing);
            } while ((local_248 <= ABS(dVar5 - (double)cres.thing)) ||
                    (dVar5 = AActor::Y((AActor *)blockdist),
                    local_248 <= ABS(dVar5 - cres.Position.X)));
            TFlags<ActorFlag2,_unsigned_int>::TFlags(&local_254,(Self *)((long)blockdist + 400));
            TFlags<ActorFlag2,_unsigned_int>::operator|(&local_250,&actor->flags2);
            TFlags<ActorFlag2,_unsigned_int>::operator&(&local_24c,(ActorFlag2)&local_250);
            uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_24c);
          } while (uVar3 != 0);
          TFlags<ActorFlag6,_unsigned_int>::operator&
                    (&local_258,iVar1 + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_BUMPSPECIAL));
          uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_258);
          local_2b9 = false;
          if (uVar3 != 0) {
            (**(code **)(*(long *)blockdist + 0x108))(&local_25c);
            (*(actor->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_260);
            local_2b9 = FName::operator==(&local_25c,&local_260);
          }
        } while (local_2b9 != false);
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_264,
                   SUB84(blockdist,0) + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
        uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_264);
      } while (uVar3 == 0);
      other = (Self *)((long)blockdist + 0x18c);
      operator|((EnumType)local_26c,MF_SPECIAL);
      TFlags<ActorFlag,_unsigned_int>::operator&(&local_268,other);
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_268);
    } while (uVar3 != 0);
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_270,
               SUB84(blockdist,0) + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_270);
    if (uVar3 != 0) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_274,iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_274);
      if (uVar3 == 0) goto LAB_00671397;
    }
    TFlags<ActorFlag4,_unsigned_int>::operator&
              (&local_278,
               SUB84(blockdist,0) + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_RANDOMIZE|MF4_BOSSDEATH)
              );
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_278);
    bVar2 = false;
    if (uVar3 == 0) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_27c,iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_27c);
      bVar2 = uVar3 != 0;
    }
    if ((bVar2) || ((AActor *)blockdist == actor)) goto LAB_00671397;
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_280,iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_280);
    dVar5 = blockdist;
    bVar2 = false;
    if (uVar3 != 0) {
      pAVar4 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&actor->target);
      bVar2 = (AActor *)dVar5 == pAVar4;
    }
    if (bVar2) goto LAB_00671397;
    dVar5 = AActor::Z(actor);
    dVar6 = AActor::Top((AActor *)blockdist);
    if (dVar6 < dVar5) goto LAB_00671397;
    dVar5 = AActor::Top(actor);
    dVar6 = AActor::Z((AActor *)blockdist);
    if (dVar5 <= dVar6) goto LAB_00671397;
    if ((!quick) && (local_30 != (AActor *)0x0)) {
      dVar5 = AActor::Top((AActor *)blockdist);
      dVar6 = AActor::Top(local_30);
      if (dVar5 < dVar6) goto LAB_00671397;
    }
    local_30 = (AActor *)blockdist;
    if (!quick) goto LAB_00671397;
LAB_0067195b:
    if (pOnmobj != (AActor **)0x0) {
      *pOnmobj = local_30;
    }
    actor_local._7_1_ = local_30 == (AActor *)0x0;
    FMultiBlockThingsIterator::~FMultiBlockThingsIterator((FMultiBlockThingsIterator *)local_200);
    FPortalGroupArray::~FPortalGroupArray((FPortalGroupArray *)(it.bbox.m_Box + 3));
  }
  else {
    if (pOnmobj != (AActor **)0x0) {
      *pOnmobj = (AActor *)0x0;
    }
    actor_local._7_1_ = true;
  }
  return actor_local._7_1_;
}

Assistant:

bool P_TestMobjZ(AActor *actor, bool quick, AActor **pOnmobj)
{
	AActor *onmobj = NULL;
	if (actor->flags & MF_NOCLIP)
	{
		if (pOnmobj) *pOnmobj = NULL;
		return true;
	}

	FPortalGroupArray check;
	FMultiBlockThingsIterator it(check, actor, -1, true);
	FMultiBlockThingsIterator::CheckResult cres;

	while (it.Next(&cres))
	{
		AActor *thing = cres.thing;

		double blockdist = thing->radius + actor->radius;
		if (fabs(thing->X() - cres.Position.X) >= blockdist || fabs(thing->Y() - cres.Position.Y) >= blockdist)
		{
			continue;
		}
		if ((actor->flags2 | thing->flags2) & MF2_THRUACTORS)
		{
			continue;
		}
		if ((actor->flags6 & MF6_THRUSPECIES) && (thing->GetSpecies() == actor->GetSpecies()))
		{
			continue;
		}
		if (!(thing->flags & MF_SOLID))
		{ // Can't hit thing
			continue;
		}
		if (thing->flags & (MF_SPECIAL | MF_NOCLIP))
		{ // [RH] Specials and noclippers don't block moves
			continue;
		}
		if (thing->flags & (MF_CORPSE))
		{ // Corpses need a few more checks
			if (!(actor->flags & MF_ICECORPSE))
				continue;
		}
		if (!(thing->flags4 & MF4_ACTLIKEBRIDGE) && (actor->flags & MF_SPECIAL))
		{ // [RH] Only bridges block pickup items
			continue;
		}
		if (thing == actor)
		{ // Don't clip against self
			continue;
		}
		if ((actor->flags & MF_MISSILE) && (thing == actor->target))
		{ // Don't clip against whoever shot the missile.
			continue;
		}
		if (actor->Z() > thing->Top())
		{ // over thing
			continue;
		}
		else if (actor->Top() <= thing->Z())
		{ // under thing
			continue;
		}
		else if (!quick && onmobj != NULL && thing->Top() < onmobj->Top())
		{ // something higher is in the way
			continue;
		}
		onmobj = thing;
		if (quick) break;
	}

	if (pOnmobj) *pOnmobj = onmobj;
	return onmobj == NULL;
}